

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O0

void __thiscall Kernel::KBO::State::recordVariable<1>(State *this,uint var)

{
  undefined4 in_ESI;
  long in_RDI;
  DHMap<unsigned_int,_int,_Lib::IdentityHash,_Lib::DefaultHash> *unaff_retaddr;
  int *pnum;
  int *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  Lib::DHMap<unsigned_int,_int,_Lib::IdentityHash,_Lib::DefaultHash>::getValuePtr
            (unaff_retaddr,(uint)((ulong)in_RDI >> 0x20),
             (int **)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  *in_stack_ffffffffffffffe8 = *in_stack_ffffffffffffffe8 + 1;
  if (*in_stack_ffffffffffffffe8 == 0) {
    *(int *)(in_RDI + 0x34) = *(int *)(in_RDI + 0x34) + -1;
  }
  else if (*in_stack_ffffffffffffffe8 == 1) {
    *(int *)(in_RDI + 0x30) = *(int *)(in_RDI + 0x30) + 1;
  }
  return;
}

Assistant:

void KBO::State::recordVariable(unsigned var)
{
  static_assert(coef==1 || coef==-1);

  int* pnum;
  _varDiffs.getValuePtr(var,pnum,0);
  (*pnum)+=coef;
  if constexpr (coef==1) {
    if(*pnum==0) {
      _negNum--;
    } else if(*pnum==1) {
      _posNum++;
    }
  } else {
    if(*pnum==0) {
      _posNum--;
    } else if(*pnum==-1) {
      _negNum++;
    }
  }
}